

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# thingdef_expression.cpp
# Opt level: O3

FxExpression * __thiscall FxFloatCast::Resolve(FxFloatCast *this,FCompileContext *ctx)

{
  PType *pPVar1;
  PString *pPVar2;
  PFloat *pPVar3;
  PName *pPVar4;
  int iVar5;
  undefined4 extraout_var;
  FxExpression *pFVar6;
  long lVar7;
  FxJumpStatement **ppFVar8;
  TArray<FxJumpStatement_*,_FxJumpStatement_*> *pTVar9;
  FxExpression *x;
  ExpVal constval;
  FString local_30;
  FxJumpStatement **local_28;
  
  if ((this->super_FxExpression).isresolved == false) {
    (this->super_FxExpression).isresolved = true;
    if (this->basex != (FxExpression *)0x0) {
      iVar5 = (*this->basex->_vptr_FxExpression[2])();
      pFVar6 = (FxExpression *)CONCAT44(extraout_var,iVar5);
      this->basex = pFVar6;
      if (pFVar6 != (FxExpression *)0x0) {
        iVar5 = (*(pFVar6->ValueType->super_DObject)._vptr_DObject[0x12])();
        pFVar6 = this->basex;
        if (iVar5 == 1) {
          this->basex = (FxExpression *)0x0;
        }
        else {
          iVar5 = (*(pFVar6->ValueType->super_DObject)._vptr_DObject[0x12])();
          pPVar4 = TypeName;
          if (iVar5 == 0) {
            pPVar1 = this->basex->ValueType;
            iVar5 = (*this->basex->_vptr_FxExpression[3])();
            if (pPVar1 != (PType *)pPVar4) {
              if ((char)iVar5 == '\0') {
                return &this->super_FxExpression;
              }
              pPVar2 = (PString *)this->basex[1]._vptr_FxExpression;
              pTVar9 = &this->basex[1].JumpAddresses;
              if (pPVar2 == TypeString) {
                FString::AttachToOther(&local_30,(FString *)pTVar9);
              }
              else {
                local_30.Chars = (char *)pTVar9->Array;
              }
              pFVar6 = (FxExpression *)operator_new(0x48);
              iVar5 = (*(pPVar2->super_PBasicType).super_PType.super_DObject._vptr_DObject[0x12])();
              local_28 = (FxJumpStatement **)local_30.Chars;
              if ((iVar5 != 1) && (local_28 = (FxJumpStatement **)0x0, iVar5 == 0)) {
                local_28 = (FxJumpStatement **)(double)(int)local_30.Chars;
              }
              FxExpression::FxExpression(pFVar6,&(this->super_FxExpression).ScriptPosition);
              pFVar6->_vptr_FxExpression = (_func_int **)&PTR__FxConstant_0088f2f0;
              pPVar3 = TypeFloat64;
              *(PFloat **)(pFVar6 + 1) = TypeFloat64;
              pFVar6->ValueType = (PType *)pPVar3;
              pFVar6[1].JumpAddresses.Array = local_28;
              pFVar6->isresolved = true;
              (*(this->super_FxExpression)._vptr_FxExpression[1])(this);
              if (pPVar2 != TypeString) {
                return pFVar6;
              }
              FString::~FString(&local_30);
              return pFVar6;
            }
            if ((char)iVar5 == '\0') {
              FScriptPosition::Message
                        (&(this->super_FxExpression).ScriptPosition,3,
                         "Numeric type expected, got a name");
            }
            else {
              pPVar2 = (PString *)this->basex[1]._vptr_FxExpression;
              pTVar9 = &this->basex[1].JumpAddresses;
              if (pPVar2 == TypeString) {
                FString::AttachToOther(&local_30,(FString *)pTVar9);
                ppFVar8 = (FxJumpStatement **)((ulong)local_30.Chars & 0xffffffff);
              }
              else {
                ppFVar8 = pTVar9->Array;
                local_30.Chars = (char *)ppFVar8;
              }
              lVar7 = (long)(int)ppFVar8;
              if (pPVar2 != (PString *)TypeName) {
                lVar7 = 0;
              }
              FScriptPosition::Message
                        (&(this->super_FxExpression).ScriptPosition,3,
                         "Numeric type expected, got \"%s\"",FName::NameData.NameArray[lVar7].Text);
              if (pPVar2 == TypeString) {
                FString::~FString(&local_30);
              }
            }
            pFVar6 = (FxExpression *)operator_new(0x48);
            FxExpression::FxExpression(pFVar6,&(this->super_FxExpression).ScriptPosition);
            pFVar6->_vptr_FxExpression = (_func_int **)&PTR__FxConstant_0088f2f0;
            pPVar3 = TypeFloat64;
            *(PFloat **)(pFVar6 + 1) = TypeFloat64;
            pFVar6->ValueType = (PType *)pPVar3;
            pFVar6[1].JumpAddresses.Array = (FxJumpStatement **)0x0;
            pFVar6->isresolved = true;
          }
          else {
            pFVar6 = (FxExpression *)0x0;
            FScriptPosition::Message
                      (&(this->super_FxExpression).ScriptPosition,2,"Numeric type expected");
          }
        }
        (*(this->super_FxExpression)._vptr_FxExpression[1])(this);
        return pFVar6;
      }
    }
    (*(this->super_FxExpression)._vptr_FxExpression[1])(this);
    this = (FxFloatCast *)0x0;
  }
  return &this->super_FxExpression;
}

Assistant:

FxExpression *FxFloatCast::Resolve(FCompileContext &ctx)
{
	CHECKRESOLVED();
	SAFE_RESOLVE(basex, ctx);

	if (basex->ValueType->GetRegType() == REGT_FLOAT)
	{
		FxExpression *x = basex;
		basex = NULL;
		delete this;
		return x;
	}
	else if (basex->ValueType->GetRegType() == REGT_INT)
	{
		if (basex->ValueType != TypeName)
		{
			if (basex->isConstant())
			{
				ExpVal constval = static_cast<FxConstant *>(basex)->GetValue();
				FxExpression *x = new FxConstant(constval.GetFloat(), ScriptPosition);
				delete this;
				return x;
			}
			return this;
		}
		else
		{
			// Ugh. This should abort, but too many mods fell into this logic hole somewhere, so this seroious error needs to be reduced to a warning. :(
			if (!basex->isConstant()) ScriptPosition.Message(MSG_OPTERROR, "Numeric type expected, got a name");
			else ScriptPosition.Message(MSG_OPTERROR, "Numeric type expected, got \"%s\"", static_cast<FxConstant*>(basex)->GetValue().GetName().GetChars());
			FxExpression *x = new FxConstant(0.0, ScriptPosition);
			delete this;
			return x;
		}
	}
	else
	{
		ScriptPosition.Message(MSG_ERROR, "Numeric type expected");
		delete this;
		return NULL;
	}
}